

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

void __thiscall kj::VectorOutputStream::grow(VectorOutputStream *this,size_t minSize)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  uchar *__dest;
  ulong elementCount;
  uchar *puVar4;
  ulong uVar5;
  undefined8 *puVar6;
  
  elementCount = (this->vector).size_;
  do {
    elementCount = elementCount * 2;
  } while (elementCount < minSize);
  __dest = (uchar *)_::HeapArrayDisposer::allocateImpl
                              (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
  puVar6 = &_::HeapArrayDisposer::instance;
  puVar1 = (this->vector).ptr;
  puVar4 = __dest;
  uVar5 = elementCount;
  memcpy(__dest,puVar1,(long)this->fillPos - (long)puVar1);
  puVar1 = (this->vector).ptr;
  this->fillPos = __dest + ((long)this->fillPos - (long)puVar1);
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->vector).size_;
    (this->vector).ptr = (uchar *)0x0;
    (this->vector).size_ = 0;
    pAVar3 = (this->vector).disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,puVar1,1,sVar2,sVar2,0,puVar4,uVar5,puVar6);
  }
  (this->vector).ptr = __dest;
  (this->vector).size_ = elementCount;
  (this->vector).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return;
}

Assistant:

void VectorOutputStream::grow(size_t minSize) {
  size_t newSize = vector.size() * 2;
  while (newSize < minSize) newSize *= 2;
  auto newVector = heapArray<byte>(newSize);
  memcpy(newVector.begin(), vector.begin(), fillPos - vector.begin());
  fillPos = fillPos - vector.begin() + newVector.begin();
  vector = kj::mv(newVector);
}